

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O3

Frame * sptk::snack::alloc_frame(int nlags,int ncands)

{
  size_t size;
  size_t size_00;
  Frame *pFVar1;
  Dprec *pDVar2;
  Cross *pCVar3;
  float *pfVar4;
  short *psVar5;
  
  pFVar1 = (Frame *)ckalloc(0x28);
  pDVar2 = (Dprec *)ckalloc(0x30);
  pFVar1->dp = pDVar2;
  pDVar2->ncands = 0;
  pCVar3 = (Cross *)ckalloc(0x18);
  pFVar1->cp = pCVar3;
  pfVar4 = (float *)ckalloc((long)nlags << 2);
  pFVar1->cp->correl = pfVar4;
  size_00 = (long)ncands * 2;
  psVar5 = (short *)ckalloc(size_00);
  pFVar1->dp->locs = psVar5;
  size = (long)ncands * 4;
  pfVar4 = (float *)ckalloc(size);
  pFVar1->dp->pvals = pfVar4;
  pfVar4 = (float *)ckalloc(size);
  pFVar1->dp->mpvals = pfVar4;
  psVar5 = (short *)ckalloc(size_00);
  pFVar1->dp->prept = psVar5;
  pfVar4 = (float *)ckalloc(size);
  pFVar1->dp->dpvals = pfVar4;
  if (0 < ncands) {
    memset(pfVar4,0,(ulong)(uint)ncands << 2);
  }
  return pFVar1;
}

Assistant:

alloc_frame(int nlags, int ncands)
#endif
{
  Frame *frm;
  int j;

  frm = (Frame*)ckalloc(sizeof(Frame));
  frm->dp = (Dprec *) ckalloc(sizeof(Dprec));
  /*  spsassert(frm->dp,"frm->dp ckalloc failed in alloc_frame");*/
  frm->dp->ncands = 0;
  frm->cp = (Cross *) ckalloc(sizeof(Cross));
  /*  spsassert(frm->cp,"frm->cp ckalloc failed in alloc_frame");*/
  frm->cp->correl = (float *) ckalloc(sizeof(float) * nlags);
  /*  spsassert(frm->cp->correl, "frm->cp->correl ckalloc failed");*/
  /* Allocate space for candidates and working arrays. */
  frm->dp->locs = (short*)ckalloc(sizeof(short) * ncands);
  /*  spsassert(frm->dp->locs,"frm->dp->locs ckalloc failed in alloc_frame()");*/
  frm->dp->pvals = (float*)ckalloc(sizeof(float) * ncands);
/*  spsassert(frm->dp->pvals,"frm->dp->pvals ckalloc failed in alloc_frame()");*/
  frm->dp->mpvals = (float*)ckalloc(sizeof(float) * ncands);
  /*  spsassert(frm->dp->mpvals,"frm->dp->mpvals ckalloc failed in alloc_frame()");*/
  frm->dp->prept = (short*)ckalloc(sizeof(short) * ncands);
  /*  spsassert(frm->dp->prept,"frm->dp->prept ckalloc failed in alloc_frame()");*/
  frm->dp->dpvals = (float*)ckalloc(sizeof(float) * ncands);
  /*  spsassert(frm->dp->dpvals,"frm->dp->dpvals ckalloc failed in alloc_frame()");*/
    
  /*  Initialize the cumulative DP costs to zero */
  for(j = ncands-1; j >= 0; j--)
    frm->dp->dpvals[j] = 0.0;

  return(frm);
}